

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs.c
# Opt level: O0

sx__job_thread_data * sx__job_create_tdata(sx_alloc *alloc,uint32_t tid,int index,_Bool main_thrd)

{
  code *pcVar1;
  _Bool _Var2;
  sx__job_thread_data *psVar3;
  size_t sVar4;
  _Bool r;
  sx__job_thread_data *tdata;
  _Bool main_thrd_local;
  int index_local;
  uint32_t tid_local;
  sx_alloc *alloc_local;
  
  psVar3 = (sx__job_thread_data *)sx__malloc(alloc,0x30,0,(char *)0x0,(char *)0x0,0);
  if (psVar3 == (sx__job_thread_data *)0x0) {
    sx__mem_run_fail_callback
              ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",0x1fa);
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                      0x1fa,"Out of memory");
    pcVar1 = (code *)swi(3);
    psVar3 = (sx__job_thread_data *)(*pcVar1)();
    return psVar3;
  }
  memset(psVar3,0,0x30);
  psVar3->thread_index = index;
  psVar3->tid = tid;
  psVar3->tags = 0xffffffff;
  psVar3->main_thrd = main_thrd;
  sVar4 = sx_os_minstacksz();
  _Var2 = sx_fiber_stack_init(&psVar3->selector_stack,(uint)sVar4);
  if (!_Var2) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                      0x204,"Not enough memory for temp stacks");
    pcVar1 = (code *)swi(3);
    psVar3 = (sx__job_thread_data *)(*pcVar1)();
    return psVar3;
  }
  return psVar3;
}

Assistant:

static sx__job_thread_data* sx__job_create_tdata(const sx_alloc* alloc, uint32_t tid, int index,
                                                 bool main_thrd)
{
    sx__job_thread_data* tdata =
        (sx__job_thread_data*)sx_malloc(alloc, sizeof(sx__job_thread_data));
    if (!tdata) {
        sx_out_of_memory();
        return NULL;
    }
    sx_memset(tdata, 0x0, sizeof(sx__job_thread_data));
    tdata->thread_index = index;
    tdata->tid = tid;
    tdata->tags = 0xffffffff;
    tdata->main_thrd = main_thrd;

    bool r = sx_fiber_stack_init(&tdata->selector_stack, (int)sx_os_minstacksz());
    sx_assertf(r, "Not enough memory for temp stacks");
    sx_unused(r);

    return tdata;
}